

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

int nni_sfd_listener_alloc(nng_stream_listener **lp,nng_url *url)

{
  nng_stream_listener *pnVar1;
  sfd_listener *l;
  nng_url *url_local;
  nng_stream_listener **lp_local;
  
  pnVar1 = (nng_stream_listener *)nni_zalloc(0xd8);
  if (pnVar1 == (nng_stream_listener *)0x0) {
    lp_local._4_4_ = 2;
  }
  else {
    memset((void *)((long)&pnVar1[1].sl_free + 4),0,0x40);
    *(undefined4 *)&pnVar1[1].sl_free = 0;
    nni_aio_list_init((nni_list *)&pnVar1[1].sl_set_security_descriptor);
    nni_mtx_init((nni_mtx *)&pnVar1[2].sl_stop);
    pnVar1->sl_free = sfd_listener_free;
    pnVar1->sl_close = sfd_listener_close;
    pnVar1->sl_stop = sfd_listener_stop;
    pnVar1->sl_listen = sfd_listener_listen;
    pnVar1->sl_accept = sfd_listener_accept;
    pnVar1->sl_get = sfd_listener_get;
    pnVar1->sl_set = sfd_listener_set;
    *lp = pnVar1;
    lp_local._4_4_ = 0;
  }
  return lp_local._4_4_;
}

Assistant:

int
nni_sfd_listener_alloc(nng_stream_listener **lp, const nng_url *url)
{
	sfd_listener *l;

	NNI_ARG_UNUSED(url);

	if ((l = NNI_ALLOC_STRUCT(l)) == NULL) {
		return (NNG_ENOMEM);
	}
	memset(l->listen_q, 0, sizeof(l->listen_q));
	l->listen_cnt = 0;
	nni_aio_list_init(&l->accept_q);
	nni_mtx_init(&l->mtx);

	l->ops.sl_free   = sfd_listener_free;
	l->ops.sl_close  = sfd_listener_close;
	l->ops.sl_stop   = sfd_listener_stop;
	l->ops.sl_listen = sfd_listener_listen;
	l->ops.sl_accept = sfd_listener_accept;
	l->ops.sl_get    = sfd_listener_get;
	l->ops.sl_set    = sfd_listener_set;

	*lp = (void *) l;
	return (0);
}